

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::read_content_chunked(Stream *strm,ContentReceiverWithProgress *out)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  __ssize_t _Var4;
  FILE *__args_3;
  unsigned_long __args_1;
  string *psVar5;
  FILE *in_RCX;
  undefined8 __stream;
  size_t *in_RDX;
  size_t *extraout_RDX;
  size_t *__n;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  size_t *extraout_RDX_02;
  size_t *extraout_RDX_03;
  size_t *extraout_RDX_04;
  size_t *extraout_RDX_05;
  size_t *__n_00;
  size_t *extraout_RDX_06;
  FILE *__args_2;
  FILE *pFVar6;
  _Any_data *__endptr;
  FILE *in_R8;
  stream_line_reader line_reader;
  char *end_ptr;
  char buf [16];
  stream_line_reader local_10e8;
  _Any_data local_10a8;
  code *local_1098;
  code *pcStack_1090;
  _Any_data *local_1088;
  _Any_data local_1080;
  undefined1 local_1070 [8];
  function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> local_1068;
  char local_1048 [16];
  _Any_data local_1038 [256];
  int extraout_var;
  
  local_10e8.glowable_buffer_._M_dataplus._M_p = (pointer)&local_10e8.glowable_buffer_.field_2;
  local_10e8.fixed_buffer_ = local_1048;
  local_10e8.fixed_buffer_size_ = 0x10;
  local_10e8.fixed_buffer_used_size_ = 0;
  local_10e8.glowable_buffer_._M_string_length = 0;
  local_10e8.glowable_buffer_.field_2._M_local_buf[0] = '\0';
  local_10e8.strm_ = strm;
  local_1088 = (_Any_data *)out;
  _Var4 = stream_line_reader::getline(&local_10e8,(char **)out,in_RDX,in_RCX);
  if ((char)_Var4 == '\0') goto LAB_00115d15;
  do {
    psVar5 = &local_10e8.glowable_buffer_;
    if (local_10e8.glowable_buffer_._M_string_length == 0) {
      psVar5 = (string *)&local_10e8.fixed_buffer_;
    }
    __endptr = &local_1080;
    __args_3 = (FILE *)strtoul((psVar5->_M_dataplus)._M_p,(char **)__endptr,0x10);
    psVar5 = &local_10e8.glowable_buffer_;
    if (local_10e8.glowable_buffer_._M_string_length == 0) {
      psVar5 = (string *)&local_10e8.fixed_buffer_;
    }
    bVar2 = 1;
    __stream = local_1080._M_unused._0_8_;
    __n = extraout_RDX;
    if (((FILE *)local_1080._M_unused._0_8_ != (FILE *)(psVar5->_M_dataplus)._M_p) &&
       (__args_3 != (FILE *)0xffffffffffffffff)) {
      if (__args_3 == (FILE *)0x0) {
        bVar2 = 3;
      }
      else {
        local_1098 = (code *)0x0;
        pcStack_1090 = (code *)0x0;
        local_10a8._M_unused._M_object = (void *)0x0;
        local_10a8._8_8_ = 0;
        __endptr = local_1088;
        std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
                  (&local_1068,
                   (function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                   local_1088);
        pFVar6 = (FILE *)0x0;
        do {
          __args_2 = pFVar6;
          __n = (size_t *)((long)__args_3 - (long)__args_2);
          if (__args_3 < __args_2 || __n == (size_t *)0x0) break;
          if ((size_t *)0xfff < __n) {
            __n = (size_t *)0x1000;
          }
          __endptr = local_1038;
          iVar3 = (*strm->_vptr_Stream[4])(strm,__endptr,__n);
          __args_1 = CONCAT44(extraout_var,iVar3);
          __n = extraout_RDX_00;
          if (__args_1 == 0 || extraout_var < 0) {
LAB_00115c22:
            bVar1 = false;
            pFVar6 = __args_2;
          }
          else {
            __endptr = local_1038;
            __stream = __args_2;
            in_R8 = __args_3;
            bVar1 = std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>
                    ::operator()(&local_1068,__endptr->_M_pod_data,__args_1,(unsigned_long)__args_2,
                                 (unsigned_long)__args_3);
            __n = extraout_RDX_01;
            if (!bVar1) goto LAB_00115c22;
            pFVar6 = (FILE *)((long)&__args_2->_flags + __args_1);
            if (local_1098 == (code *)0x0) {
LAB_00115c1e:
              bVar1 = true;
            }
            else {
              __endptr = (_Any_data *)local_1070;
              local_1080._8_8_ = __args_3;
              local_1070 = (undefined1  [8])pFVar6;
              bVar1 = (*pcStack_1090)(&local_10a8,(char **)__endptr,
                                      (unsigned_long *)(local_1080._M_pod_data + 8),
                                      (unsigned_long *)__stream,(unsigned_long *)in_R8);
              __n = extraout_RDX_02;
              if (bVar1) goto LAB_00115c1e;
              bVar1 = false;
            }
          }
        } while (bVar1);
        if (local_1068.super__Function_base._M_manager != (_Manager_type)0x0) {
          __endptr = (_Any_data *)&local_1068;
          (*local_1068.super__Function_base._M_manager)
                    (__endptr,(char **)__endptr,(unsigned_long *)0x3,(unsigned_long *)__stream,
                     (unsigned_long *)in_R8);
          __n = extraout_RDX_03;
        }
        if (local_1098 != (code *)0x0) {
          __endptr = &local_10a8;
          (*local_1098)(__endptr,__endptr,__destroy_functor);
          __n = extraout_RDX_04;
        }
        if (__args_3 <= __args_2) {
          _Var4 = stream_line_reader::getline(&local_10e8,(char **)__endptr,__n,(FILE *)__stream);
          __n = extraout_RDX_05;
          if ((char)_Var4 != '\0') {
            psVar5 = &local_10e8.glowable_buffer_;
            if (local_10e8.glowable_buffer_._M_string_length == 0) {
              psVar5 = (string *)&local_10e8.fixed_buffer_;
            }
            __endptr = (_Any_data *)0x12ff45;
            iVar3 = strcmp((psVar5->_M_dataplus)._M_p,"\r\n");
            bVar2 = 3;
            __n = __n_00;
            if (iVar3 == 0) {
              _Var4 = stream_line_reader::getline
                                (&local_10e8,(char **)__endptr,__n_00,(FILE *)__stream);
              bVar2 = (byte)_Var4 ^ 1;
              __n = extraout_RDX_06;
            }
          }
        }
      }
    }
  } while (bVar2 == 0);
  if (bVar2 != 3) {
    bVar1 = false;
    goto LAB_00115d17;
  }
  if (__args_3 == (FILE *)0x0) {
    _Var4 = stream_line_reader::getline(&local_10e8,(char **)__endptr,__n,(FILE *)__stream);
    if ((char)_Var4 != '\0') {
      psVar5 = &local_10e8.glowable_buffer_;
      if (local_10e8.glowable_buffer_._M_string_length == 0) {
        psVar5 = (string *)&local_10e8.fixed_buffer_;
      }
      iVar3 = strcmp((psVar5->_M_dataplus)._M_p,"\r\n");
      if (iVar3 == 0) goto LAB_00115cdf;
    }
LAB_00115d15:
    bVar1 = false;
  }
  else {
LAB_00115cdf:
    bVar1 = true;
  }
LAB_00115d17:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10e8.glowable_buffer_._M_dataplus._M_p != &local_10e8.glowable_buffer_.field_2) {
    operator_delete(local_10e8.glowable_buffer_._M_dataplus._M_p,
                    CONCAT71(local_10e8.glowable_buffer_.field_2._M_allocated_capacity._1_7_,
                             local_10e8.glowable_buffer_.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

inline bool read_content_chunked(Stream &strm,
										 ContentReceiverWithProgress out) {
			const auto bufsiz = 16;
			char buf[bufsiz];

			stream_line_reader line_reader(strm, buf, bufsiz);

			if (!line_reader.getline()) { return false; }

			unsigned long chunk_len;
			while (true) {
				char *end_ptr;

				chunk_len = std::strtoul(line_reader.ptr(), &end_ptr, 16);

				if (end_ptr == line_reader.ptr()) { return false; }
				if (chunk_len == ULONG_MAX) { return false; }

				if (chunk_len == 0) { break; }

				if (!read_content_with_length(strm, chunk_len, nullptr, out)) {
					return false;
				}

				if (!line_reader.getline()) { return false; }

				if (strcmp(line_reader.ptr(), "\r\n")) { break; }

				if (!line_reader.getline()) { return false; }
			}

			if (chunk_len == 0) {
				// Reader terminator after chunks
				if (!line_reader.getline() || strcmp(line_reader.ptr(), "\r\n"))
					return false;
			}

			return true;
		}